

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O1

int Fxu_Select(Fxu_Matrix *p,Fxu_Single **ppSingle,Fxu_Double **ppDouble)

{
  long lVar1;
  Fxu_Pair *pFVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Fxu_Single *pFVar6;
  Fxu_Double *pFVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  Fxu_Matrix *p_00;
  ulong uVar13;
  int nVarsC1;
  int piVarsC2 [10];
  int iVar1C;
  Fxu_Double *pDoubles [20];
  Fxu_Single *pSingles [20];
  Fxu_Single *pDComplS [20];
  Fxu_Double *pSCompl [20];
  int local_330;
  int local_32c;
  Fxu_Single **local_328;
  Fxu_Double **local_320;
  uint local_318 [12];
  uint local_2e8 [12];
  long local_2b8 [20];
  long local_218 [20];
  long local_178 [20];
  long local_d8 [21];
  
  uVar12 = 0;
  local_328 = ppSingle;
  memset(local_218,0,0xa0);
  memset(local_2b8,0,0xa0);
  memset(local_d8,0,0xa0);
  memset(local_178,0,0xa0);
  do {
    pFVar6 = Fxu_HeapSingleGetMax(p->pHeapSingle);
    local_218[uVar12] = (long)pFVar6;
    if (pFVar6 == (Fxu_Single *)0x0) goto LAB_0043ed96;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x14);
  uVar12 = 0x14;
LAB_0043ed96:
  iVar9 = (int)uVar12;
  uVar12 = uVar12 & 0xffffffff;
  if (iVar9 != 0) {
    uVar11 = 0;
    do {
      if ((Fxu_Single *)local_218[uVar11] != (Fxu_Single *)0x0) {
        Fxu_HeapSingleInsert(p->pHeapSingle,(Fxu_Single *)local_218[uVar11]);
      }
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  uVar11 = 0;
  do {
    p_00 = (Fxu_Matrix *)p->pHeapDouble;
    pFVar7 = Fxu_HeapDoubleGetMax((Fxu_HeapDouble *)p_00);
    local_2b8[uVar11] = (long)pFVar7;
    if (pFVar7 == (Fxu_Double *)0x0) goto LAB_0043ede3;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x14);
  uVar11 = 0x14;
LAB_0043ede3:
  iVar10 = (int)uVar11;
  uVar11 = uVar11 & 0xffffffff;
  local_320 = ppDouble;
  if (iVar10 != 0) {
    uVar13 = 0;
    do {
      if ((Fxu_Double *)local_2b8[uVar13] != (Fxu_Double *)0x0) {
        p_00 = (Fxu_Matrix *)p->pHeapDouble;
        Fxu_HeapDoubleInsert((Fxu_HeapDouble *)p_00,(Fxu_Double *)local_2b8[uVar13]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (iVar9 != 0) {
    uVar13 = 0;
    do {
      lVar1 = local_218[uVar13];
      if (lVar1 != 0) {
        local_2e8[0] = **(uint **)(lVar1 + 0x10) ^ 1;
        local_318[0] = **(uint **)(lVar1 + 0x18) ^ 1;
        if (**(uint **)(lVar1 + 0x18) == 0xfffffffe || **(uint **)(lVar1 + 0x10) == 0xfffffffe) {
          pFVar7 = (Fxu_Double *)0x0;
        }
        else {
          if ((int)local_318[0] <= (int)local_2e8[0]) {
            __assert_fail("iVar1C < iVar2C",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0xea,
                          "Fxu_Double *Fxu_MatrixFindComplementSingle(Fxu_Matrix *, Fxu_Single *)");
          }
          p_00 = p;
          pFVar7 = Fxu_MatrixFindDouble(p,(int *)local_2e8,(int *)local_318,1,1);
        }
        local_d8[uVar13] = (long)pFVar7;
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if (iVar10 != 0) {
    uVar13 = 0;
    do {
      pFVar7 = (Fxu_Double *)local_2b8[uVar13];
      if (pFVar7 != (Fxu_Double *)0x0) {
        pFVar2 = (pFVar7->lPairs).pHead;
        if ((pFVar2->nLits1 == 1) && (pFVar2->nLits2 == 1)) {
          Fxu_MatrixGetDoubleVars
                    (p_00,pFVar7,(int *)local_2e8,(int *)local_318,&local_32c,&local_330);
          if (local_32c != 1) {
            __assert_fail("nVarsC1 == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0x104,
                          "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)")
            ;
          }
          if (local_330 != 1) {
            __assert_fail("nVarsC2 == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0x105,
                          "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)")
            ;
          }
          if ((int)local_318[0] <= (int)local_2e8[0]) {
            __assert_fail("iVar1 < iVar2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                          ,0x108,
                          "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)")
            ;
          }
          if (local_318[0] != 0xfffffffe && local_2e8[0] != 0xfffffffe) {
            uVar8 = local_318[0] ^ 1;
            uVar4 = local_2e8[0] ^ 1;
            uVar3 = uVar8;
            if ((int)uVar4 < (int)uVar8) {
              uVar3 = uVar4;
            }
            if ((int)uVar4 <= (int)uVar8) {
              uVar4 = uVar8;
            }
            for (pFVar6 = (p->lSingles).pHead; pFVar6 != (Fxu_Single *)0x0; pFVar6 = pFVar6->pNext)
            {
              if ((pFVar6->pVar1->iVar == uVar3) && (pFVar6->pVar2->iVar == uVar4))
              goto LAB_0043ef07;
            }
          }
        }
        pFVar6 = (Fxu_Single *)0x0;
LAB_0043ef07:
        local_178[uVar13] = (long)pFVar6;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  iVar5 = -1;
  if (iVar9 != 0) {
    uVar13 = 0;
    do {
      iVar9 = ((Fxu_Single *)local_218[uVar13])->Weight;
      pFVar7 = (Fxu_Double *)local_d8[uVar13];
      if (pFVar7 != (Fxu_Double *)0x0) {
        pFVar2 = (pFVar7->lPairs).pHead;
        iVar9 = iVar9 + pFVar7->Weight + pFVar2->nLits1 + pFVar2->nLits2;
      }
      if (iVar5 < iVar9) {
        *local_328 = (Fxu_Single *)local_218[uVar13];
        *local_320 = pFVar7;
        iVar5 = iVar9;
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if (iVar10 != 0) {
    uVar12 = 0;
    do {
      pFVar7 = (Fxu_Double *)local_2b8[uVar12];
      iVar9 = pFVar7->Weight;
      pFVar6 = (Fxu_Single *)local_178[uVar12];
      if (pFVar6 != (Fxu_Single *)0x0) {
        pFVar2 = (pFVar7->lPairs).pHead;
        iVar9 = iVar9 + pFVar6->Weight + pFVar2->nLits1 + pFVar2->nLits2;
      }
      if (iVar5 < iVar9) {
        *local_328 = pFVar6;
        *local_320 = pFVar7;
        iVar5 = iVar9;
      }
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  return iVar5;
}

Assistant:

int Fxu_Select( Fxu_Matrix * p, Fxu_Single ** ppSingle, Fxu_Double ** ppDouble )
{
    // the top entries
    Fxu_Single * pSingles[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDoubles[MAX_SIZE_LOOKAHEAD] = {0};
    // the complements
    Fxu_Double * pSCompl[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Single * pDComplS[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDComplD[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Pair * pPair;
    int nSingles;
    int nDoubles;
    int i;
    int WeightBest;
    int WeightCur;
    int iNum, fBestS;

    // collect the top entries from the queues
    for ( nSingles = 0; nSingles < MAX_SIZE_LOOKAHEAD; nSingles++ )
    {
        pSingles[nSingles] = Fxu_HeapSingleGetMax( p->pHeapSingle );
        if ( pSingles[nSingles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            Fxu_HeapSingleInsert( p->pHeapSingle, pSingles[i] );
        
    // the same for doubles
    // collect the top entries from the queues
    for ( nDoubles = 0; nDoubles < MAX_SIZE_LOOKAHEAD; nDoubles++ )
    {
        pDoubles[nDoubles] = Fxu_HeapDoubleGetMax( p->pHeapDouble );
        if ( pDoubles[nDoubles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
            Fxu_HeapDoubleInsert( p->pHeapDouble, pDoubles[i] );

    // for each single, find the complement double (if any)
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            pSCompl[i] = Fxu_MatrixFindComplementSingle( p, pSingles[i] );

    // for each double, find the complement single or double (if any)
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
        {
            pPair = pDoubles[i]->lPairs.pHead;
            if ( pPair->nLits1 == 1 && pPair->nLits2 == 1 )
            {
                pDComplS[i] = Fxu_MatrixFindComplementDouble2( p, pDoubles[i] );
                pDComplD[i] = NULL;
            }
//            else if ( pPair->nLits1 == 2 && pPair->nLits2 == 2 )
//            {
//                pDComplS[i] = NULL;
//                pDComplD[i] = Fxu_MatrixFindComplementDouble4( p, pDoubles[i] );
//            }
            else
            {
                pDComplS[i] = NULL;
                pDComplD[i] = NULL;
            }
        }

    // select the best pair
    WeightBest = -1;
    for ( i = 0; i < nSingles; i++ )
    {
        WeightCur = pSingles[i]->Weight;
        if ( pSCompl[i] )
        {
            // add the weight of the double
            WeightCur += pSCompl[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pSCompl[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pSingles[i];
            *ppDouble = pSCompl[i];
            fBestS = 1;
            iNum = i;
        }
    }
    for ( i = 0; i < nDoubles; i++ )
    {
        WeightCur = pDoubles[i]->Weight;
        if ( pDComplS[i] )
        {
            // add the weight of the single
            WeightCur += pDComplS[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pDoubles[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pDComplS[i];
            *ppDouble = pDoubles[i];
            fBestS = 0;
            iNum = i;
        }
    }
/*
    // print the statistics
    printf( "\n" );
    for ( i = 0; i < nSingles; i++ )
    {
        printf( "Single #%d: Weight = %3d. ", i, pSingles[i]->Weight );
        printf( "Compl: " );
        if ( pSCompl[i] == NULL )
            printf( "None." );
        else
            printf( "D  Weight = %3d  Sum = %3d", 
                pSCompl[i]->Weight, pSCompl[i]->Weight + pSingles[i]->Weight );
        printf( "\n" );
    }
    printf( "\n" );
    for ( i = 0; i < nDoubles; i++ )
    {
        printf( "Double #%d: Weight = %3d. ", i, pDoubles[i]->Weight );
        printf( "Compl: " );
        if ( pDComplS[i] == NULL && pDComplD[i] == NULL )
            printf( "None." );
        else if ( pDComplS[i] )
            printf( "S  Weight = %3d  Sum = %3d", 
                pDComplS[i]->Weight, pDComplS[i]->Weight + pDoubles[i]->Weight );
        else if ( pDComplD[i] )
            printf( "D  Weight = %3d  Sum = %3d", 
                pDComplD[i]->Weight, pDComplD[i]->Weight + pDoubles[i]->Weight );
        printf( "\n" );
    }
    if ( WeightBest == -1 )
        printf( "Selected NONE\n" );
    else
    {
        printf( "Selected = %s.  ", fBestS? "S": "D" );
        printf( "Number = %d.  ", iNum );
        printf( "Weight = %d.\n", WeightBest );
    }
    printf( "\n" );
*/
    return WeightBest;
}